

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O0

void __thiscall
cmParseMumpsCoverage::cmParseMumpsCoverage
          (cmParseMumpsCoverage *this,cmCTestCoverageHandlerContainer *cont,cmCTest *ctest)

{
  cmCTest *ctest_local;
  cmCTestCoverageHandlerContainer *cont_local;
  cmParseMumpsCoverage *this_local;
  
  this->_vptr_cmParseMumpsCoverage = (_func_int **)&PTR__cmParseMumpsCoverage_00c155d0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->RoutineToDirectory);
  this->Coverage = cont;
  this->CTest = ctest;
  return;
}

Assistant:

cmParseMumpsCoverage::cmParseMumpsCoverage(
  cmCTestCoverageHandlerContainer& cont,
  cmCTest* ctest)
  :Coverage(cont), CTest(ctest)
{
}